

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

string * __thiscall
xla::GraphCycles::Path_abi_cxx11_
          (string *__return_storage_ptr__,GraphCycles *this,int x,int y,int max_path_len)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  char buf [20];
  int32_t path [20];
  
  if ((Path[abi:cxx11](int,int,int)::kPathSize == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Path[abi:cxx11](int,int,int)::kPathSize), iVar2 != 0)) {
    Path::kPathSize = max_path_len;
    __cxa_guard_release(&Path[abi:cxx11](int,int,int)::kPathSize);
  }
  uVar1 = FindPath(this,x,y,Path::kPathSize,path);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  uVar3 = 0;
  while( true ) {
    if (uVar1 == uVar3) {
      return __return_storage_ptr__;
    }
    if ((long)Path::kPathSize <= (long)uVar3) break;
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    snprintf(buf,0x14,"%d",(ulong)(uint)path[uVar3]);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GraphCycles::Path(int x, int y, const int max_path_len) {
  static const int kPathSize = max_path_len;
  int32_t path[max_path_len_20];
  int np = FindPath(x, y, kPathSize, path);
  std::string result;
  for (int i = 0; i < np; i++) {
      if (i >= kPathSize) {
          result += " ...";
          break;
      }
      if (!result.empty())
          result.push_back(' ');
      char buf[20];
      snprintf(buf, sizeof(buf), "%d", path[i]);
      result += buf;
  }
  return result;
}